

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadSubsectors<mapsubsector4_t,mapseg4_t>(MapData *map)

{
  uint uVar1;
  FileReader *pFVar2;
  int iVar3;
  subsector_t *psVar4;
  ulong in_RAX;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  mapsubsector4_t subd;
  undefined8 uStack_38;
  
  pFVar2 = map->MapLumps[5].Reader;
  if (pFVar2 == (FileReader *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (uint)pFVar2->Length;
  }
  pFVar2 = map->MapLumps[6].Reader;
  if (pFVar2 == (FileReader *)0x0) {
    numsubsectors = 0;
  }
  else {
    uVar1 = (uint)pFVar2->Length;
    numsubsectors = uVar1 / 6;
    if ((0xf < uVar6) && (5 < uVar1)) {
      uStack_38 = in_RAX;
      subsectors = (subsector_t *)operator_new__((ulong)(uint)numsubsectors * 0x60);
      map->file = pFVar2;
      (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar2,0,0);
      memset(subsectors,0,(long)numsubsectors * 0x60);
      if (numsubsectors < 1) {
        return;
      }
      uVar6 = uVar6 >> 4;
      lVar7 = 0x28;
      uVar8 = 0;
      while( true ) {
        pFVar2 = map->file;
        (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,(long)&uStack_38 + 2,2);
        (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,(long)&uStack_38 + 4,4);
        psVar4 = subsectors;
        if (uStack_38._2_2_ == 0) break;
        *(uint *)((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector + lVar7) =
             (uint)uStack_38._2_2_;
        *(ulong *)((long)(psVar4->portalcoverage + -5) + lVar7) = uStack_38 >> 0x20;
        uVar5 = *(ulong *)((long)(subsectors->portalcoverage + -5) + lVar7);
        iVar3 = (int)uVar5;
        if (uVar6 <= uVar5) {
          uVar1 = *(uint *)((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector +
                           lVar7);
LAB_0056a64f:
          Printf("Subsector %d contains invalid segs %u-%u\nThe BSP will be rebuilt.\n",
                 uVar8 & 0xffffffff,uVar5,(ulong)((iVar3 + uVar1) - 1));
          ForceNodeBuild = true;
          if (nodes != (node_t *)0x0) {
            operator_delete__(nodes);
          }
          if (subsectors == (subsector_t *)0x0) {
            return;
          }
          operator_delete__(subsectors);
          return;
        }
        uVar1 = *(uint *)((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector + lVar7)
        ;
        if ((ulong)uVar6 < uVar1 + uVar5) {
          uVar5 = (ulong)uVar6;
          goto LAB_0056a64f;
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x60;
        if ((long)numsubsectors <= (long)uVar8) {
          return;
        }
      }
      Printf("Subsector %i is empty.\n",uVar8 & 0xffffffff);
      if (subsectors != (subsector_t *)0x0) {
        operator_delete__(subsectors);
      }
      goto LAB_0056a5de;
    }
  }
  Printf("This map has an incomplete BSP tree.\n");
LAB_0056a5de:
  if (nodes != (node_t *)0x0) {
    operator_delete__(nodes);
  }
  ForceNodeBuild = true;
  return;
}

Assistant:

void P_LoadSubsectors (MapData * map)
{
	int i;
	DWORD maxseg = map->Size(ML_SEGS) / sizeof(segtype);

	numsubsectors = map->Size(ML_SSECTORS) / sizeof(subsectortype);

	if (numsubsectors == 0 || maxseg == 0 )
	{
		Printf ("This map has an incomplete BSP tree.\n");
		delete[] nodes;
		ForceNodeBuild = true;
		return;
	}

	subsectors = new subsector_t[numsubsectors];		
	map->Seek(ML_SSECTORS);
		
	memset (subsectors, 0, numsubsectors*sizeof(subsector_t));
	
	for (i = 0; i < numsubsectors; i++)
	{
		subsectortype subd;

		(*map->file) >> subd.numsegs >> subd.firstseg;

		if (subd.numsegs == 0)
		{
			Printf ("Subsector %i is empty.\n", i);
			delete[] subsectors;
			delete[] nodes;
			ForceNodeBuild = true;
			return;
		}

		subsectors[i].numlines = subd.numsegs;
		subsectors[i].firstline = (seg_t *)(size_t)subd.firstseg;

		if ((size_t)subsectors[i].firstline >= maxseg)
		{
			Printf ("Subsector %d contains invalid segs %u-%u\n"
				"The BSP will be rebuilt.\n", i, (unsigned)((size_t)subsectors[i].firstline),
				(unsigned)((size_t)subsectors[i].firstline) + subsectors[i].numlines - 1);
			ForceNodeBuild = true;
			delete[] nodes;
			delete[] subsectors;
			break;
		}
		else if ((size_t)subsectors[i].firstline + subsectors[i].numlines > maxseg)
		{
			Printf ("Subsector %d contains invalid segs %u-%u\n"
				"The BSP will be rebuilt.\n", i, maxseg,
				(unsigned)((size_t)subsectors[i].firstline) + subsectors[i].numlines - 1);
			ForceNodeBuild = true;
			delete[] nodes;
			delete[] subsectors;
			break;
		}
	}
}